

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbITMask(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *pMVar2;
  int64_t iVar3;
  int64_t iVar4;
  uint uStack_34;
  _Bool T;
  uint e;
  uint Pos;
  uint NumTZ;
  uint CondBit0;
  uint Firstcond;
  uint Mask;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  pMVar2 = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(pMVar2);
  pMVar2 = MCInst_getOperand(MI,OpNum - 1);
  iVar4 = MCOperand_getImm(pMVar2);
  uVar1 = CountTrailingZeros_32((uint32_t)iVar3);
  for (uStack_34 = 3; uVar1 < uStack_34; uStack_34 = uStack_34 - 1) {
    if (((uint32_t)iVar3 >> ((byte)uStack_34 & 0x1f) & 1) == ((uint)iVar4 & 1)) {
      SStream_concat0(O,"t");
    }
    else {
      SStream_concat0(O,"e");
    }
  }
  return;
}

Assistant:

static void printThumbITMask(MCInst *MI, unsigned OpNum, SStream *O)
{
	// (3 - the number of trailing zeros) is the number of then / else.
	unsigned Mask = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned Firstcond = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum-1));
	unsigned CondBit0 = Firstcond & 1;
	unsigned NumTZ = CountTrailingZeros_32(Mask);
	//assert(NumTZ <= 3 && "Invalid IT mask!");
	unsigned Pos, e;
	for (Pos = 3, e = NumTZ; Pos > e; --Pos) {
		bool T = ((Mask >> Pos) & 1) == CondBit0;
		if (T)
			SStream_concat0(O, "t");
		else
			SStream_concat0(O, "e");
	}
}